

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingInfoWrapper.cpp
# Opt level: O1

void __thiscall VulkanUtilities::RenderingInfoWrapper::ResetClears(RenderingInfoWrapper *this)

{
  VkClearValue *pVVar1;
  VkRenderingAttachmentInfo *pVVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  string msg;
  string local_50;
  
  uVar4 = this->m_AttachmentClearMask;
  if (uVar4 != 0) {
    do {
      uVar5 = uVar4 - 1 & uVar4;
      this->m_AttachmentClearMask = uVar5;
      uVar3 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      if ((((this->m_RI).colorAttachmentCount -
           (uint)((this->m_RI).pDepthAttachment == (VkRenderingAttachmentInfo *)0x0)) + 2) -
          (uint)((this->m_RI).pStencilAttachment == (VkRenderingAttachmentInfo *)0x0) <= uVar3) {
        Diligent::FormatString<char[26],char[124]>
                  (&local_50,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "Idx < m_RI.colorAttachmentCount + (m_RI.pDepthAttachment != nullptr ? 1 : 0) + (m_RI.pStencilAttachment != nullptr ? 1 : 0)"
                   ,(char (*) [124])(ulong)uVar5);
        Diligent::DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"ResetClears",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/RenderingInfoWrapper.cpp"
                   ,0x5e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      pVVar2 = (this->m_Attachments)._M_t.
               super___uniq_ptr_impl<VkRenderingAttachmentInfo,_std::default_delete<VkRenderingAttachmentInfo[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_VkRenderingAttachmentInfo_*,_std::default_delete<VkRenderingAttachmentInfo[]>_>
               .super__Head_base<0UL,_VkRenderingAttachmentInfo_*,_false>._M_head_impl;
      pVVar2[uVar3].loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
      pVVar1 = &pVVar2[uVar3].clearValue;
      *(float *)pVVar1 = 0.0;
      *(uint32_t *)((long)&pVVar1->depthStencil + 4) = 0;
      ((VkClearDepthStencilValue *)((long)pVVar1 + 8))->depth = 0.0;
      ((VkClearDepthStencilValue *)((long)pVVar1 + 8))->stencil = 0;
      uVar4 = this->m_AttachmentClearMask;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void RenderingInfoWrapper::ResetClears()
{
    while (m_AttachmentClearMask != 0)
    {
        uint32_t Bit = Diligent::ExtractLSB(m_AttachmentClearMask);
        uint32_t Idx = Diligent::PlatformMisc::GetLSB(Bit);
        VERIFY_EXPR(Idx < m_RI.colorAttachmentCount + (m_RI.pDepthAttachment != nullptr ? 1 : 0) + (m_RI.pStencilAttachment != nullptr ? 1 : 0));
        m_Attachments[Idx].loadOp     = VK_ATTACHMENT_LOAD_OP_LOAD;
        m_Attachments[Idx].clearValue = {};
    }
}